

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

uint tree_sitter_gdscript_external_scanner_serialize(void *payload,char *buffer)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong __n;
  
  uVar2 = **(uint **)((long)payload + 8);
  uVar3 = 0xff;
  if (uVar2 < 0xff) {
    uVar3 = uVar2;
  }
  __n = (ulong)uVar3;
  *buffer = (char)uVar3;
  if (uVar2 != 0) {
    memcpy(buffer + 1,*(void **)(*(long *)((long)payload + 8) + 8),__n);
  }
  puVar5 = *payload;
  if (*puVar5 < 2) {
    iVar4 = 1;
  }
  else {
    uVar6 = 1;
    do {
      buffer[uVar6 + __n] = *(char *)(*(long *)(puVar5 + 2) + uVar6 * 2);
      uVar1 = uVar6 + 1;
      puVar5 = *payload;
      if (*puVar5 <= uVar1) break;
      uVar7 = uVar6 + __n;
      uVar6 = uVar1;
    } while (uVar7 < 0x3ff);
    iVar4 = (int)uVar1;
  }
  return iVar4 + uVar3;
}

Assistant:

unsigned tree_sitter_gdscript_external_scanner_serialize(void *payload,
                                                         char *buffer) {
    Scanner *scanner = (Scanner *)payload;

    size_t size = 0;

    size_t delimiter_count = scanner->delimiters->len;
    if (delimiter_count > UINT8_MAX) {
        delimiter_count = UINT8_MAX;
    }
    buffer[size++] = (char)delimiter_count;

    if (delimiter_count > 0) {
        memcpy(&buffer[size], scanner->delimiters->data, delimiter_count);
    }
    size += delimiter_count;

    for (int iter = 1; iter < scanner->indents->len &&
                       size < TREE_SITTER_SERIALIZATION_BUFFER_SIZE;
         ++iter) {
        buffer[size++] = (char)scanner->indents->data[iter];
    }

    return size;
}